

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.c
# Opt level: O2

void * hashmap_get_with_hash(hashmap *map,void *key,uint64_t hash)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  void *pvVar6;
  
  uVar3 = map->mask;
  uVar5 = uVar3 & hash & 0xffffffffffff;
  do {
    lVar4 = map->bucketsz * uVar5;
    uVar1 = *(ulong *)((long)map->buckets + lVar4);
    if (uVar1 < 0x1000000000000) {
      return (void *)0x0;
    }
    if ((uVar1 & 0xffffffffffff) == (hash & 0xffffffffffff)) {
      pvVar6 = (void *)((long)map->buckets + lVar4 + 8);
      if (map->compare == (_func_int_void_ptr_void_ptr_void_ptr *)0x0) {
        return pvVar6;
      }
      iVar2 = (*map->compare)(key,pvVar6,map->udata);
      if (iVar2 == 0) {
        return pvVar6;
      }
      uVar3 = map->mask;
    }
    uVar5 = uVar5 + 1 & uVar3;
  } while( true );
}

Assistant:

const void *hashmap_get_with_hash(struct hashmap *map, const void *key, 
    uint64_t hash)
{
    hash = clip_hash(hash);
    size_t i = hash & map->mask;
    while(1) {
        struct bucket *bucket = bucket_at(map, i);
        if (!bucket->dib) return NULL;
        if (bucket->hash == hash) {
            void *bitem = bucket_item(bucket);
            if (!map->compare || map->compare(key, bitem, map->udata) == 0) {
                return bitem;
            }
        }
        i = (i + 1) & map->mask;
    }
}